

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

Vec_Int_t * Wlc_NtkFindReachablePiFo(Wlc_Ntk_t *p,Vec_Int_t *vMemObjsClean,int nFrames)

{
  int iVar1;
  int Entry2;
  Vec_Int_t *p_00;
  Wlc_Obj_t *pWVar2;
  Wlc_Obj_t *pWVar3;
  Wlc_Obj_t *p_01;
  Wlc_Obj_t *pWVar4;
  int local_50;
  int fFanin;
  int f;
  int k;
  int j;
  int i;
  Wlc_Obj_t *pObj;
  Wlc_Obj_t *pObjI;
  Wlc_Obj_t *pObjR;
  Vec_Int_t *vRes;
  int nFrames_local;
  Vec_Int_t *vMemObjsClean_local;
  Wlc_Ntk_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  for (k = 1; iVar1 = Wlc_NtkObjNumMax(p), k < iVar1; k = k + 1) {
    pWVar2 = Wlc_NtkObj(p,k);
    *(ushort *)pWVar2 = *(ushort *)pWVar2 & 0xfeff;
  }
  for (k = 0; iVar1 = Vec_IntSize(vMemObjsClean), k < iVar1; k = k + 1) {
    iVar1 = Vec_IntEntry(vMemObjsClean,k);
    pWVar2 = Wlc_NtkObj(p,iVar1);
    iVar1 = Wlc_ObjIsRead(pWVar2);
    if (iVar1 != 0) {
      for (f = 0; iVar1 = Vec_IntSize(vMemObjsClean), f < iVar1; f = f + 1) {
        iVar1 = Vec_IntEntry(vMemObjsClean,f);
        pWVar3 = Wlc_NtkObj(p,iVar1);
        iVar1 = Wlc_ObjIsCi(pWVar3);
        if (iVar1 != 0) {
          *(ushort *)pWVar3 = *(ushort *)pWVar3 & 0xfeff | 0x100;
          for (fFanin = 0; iVar1 = Vec_IntSize(vMemObjsClean), fFanin < iVar1; fFanin = fFanin + 1)
          {
            iVar1 = Vec_IntEntry(vMemObjsClean,fFanin);
            p_01 = Wlc_NtkObj(p,iVar1);
            if (p_01 != pWVar3) {
              if ((*(ushort *)p_01 >> 8 & 1) != 0) {
                __assert_fail("pObj->Mark2 == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                              ,0x4d9,
                              "Vec_Int_t *Wlc_NtkFindReachablePiFo(Wlc_Ntk_t *, Vec_Int_t *, int)");
              }
              for (local_50 = 0; iVar1 = Wlc_ObjFaninNum(p_01), local_50 < iVar1;
                  local_50 = local_50 + 1) {
                iVar1 = Wlc_ObjFaninId(p_01,local_50);
                pWVar4 = Wlc_NtkObj(p,iVar1);
                *(ushort *)p_01 =
                     *(ushort *)p_01 & 0xfeff |
                     (*(ushort *)p_01 >> 8 & 1 | *(ushort *)pWVar4 >> 8 & 1) << 8;
              }
            }
          }
          if ((*(ushort *)pWVar2 >> 8 & 1) != 0) {
            iVar1 = Wlc_ObjId(p,pWVar2);
            Entry2 = Wlc_ObjId(p,pWVar3);
            Vec_IntPushThree(p_00,iVar1,Entry2,-1);
          }
          for (fFanin = 0; iVar1 = Vec_IntSize(vMemObjsClean), fFanin < iVar1; fFanin = fFanin + 1)
          {
            iVar1 = Vec_IntEntry(vMemObjsClean,fFanin);
            pWVar3 = Wlc_NtkObj(p,iVar1);
            *(ushort *)pWVar3 = *(ushort *)pWVar3 & 0xfeff;
          }
        }
      }
    }
  }
  k = 1;
  while( true ) {
    iVar1 = Wlc_NtkObjNumMax(p);
    if (iVar1 <= k) {
      return p_00;
    }
    pWVar2 = Wlc_NtkObj(p,k);
    if ((*(ushort *)pWVar2 >> 8 & 1) != 0) break;
    k = k + 1;
  }
  __assert_fail("pObj->Mark2 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                ,0x4e4,"Vec_Int_t *Wlc_NtkFindReachablePiFo(Wlc_Ntk_t *, Vec_Int_t *, int)");
}

Assistant:

Vec_Int_t * Wlc_NtkFindReachablePiFo( Wlc_Ntk_t * p, Vec_Int_t * vMemObjsClean, int nFrames )
{
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    Wlc_Obj_t * pObjR, * pObjI, * pObj; 
    int i, j, k, f, fFanin;
    Wlc_NtkForEachObj( p, pObj, i )
        pObj->Mark2 = 0;
    // go through read ports
    Wlc_NtkForEachObjVec( vMemObjsClean, p, pObjR, i ) if ( Wlc_ObjIsRead(pObjR) )
    {
        // go through memory CIs
        Wlc_NtkForEachObjVec( vMemObjsClean, p, pObjI, j ) if ( Wlc_ObjIsCi(pObjI) )
        {
            // propagate bit from CI to READ
            pObjI->Mark2 = 1;
            Wlc_NtkForEachObjVec( vMemObjsClean, p, pObj, k )
            {
                if ( pObj == pObjI )
                    continue;
                assert( pObj->Mark2 == 0 );
                Wlc_ObjForEachFanin( pObj, fFanin, f )
                    pObj->Mark2 |= Wlc_NtkObj(p, fFanin)->Mark2;
            }
            if ( pObjR->Mark2 )
                Vec_IntPushThree( vRes, Wlc_ObjId(p, pObjR), Wlc_ObjId(p, pObjI), -1 );
            Wlc_NtkForEachObjVec( vMemObjsClean, p, pObj, k )
                pObj->Mark2 = 0;
        }
    }
    Wlc_NtkForEachObj( p, pObj, i )
        assert( pObj->Mark2 == 0 );
    return vRes;
}